

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.hpp
# Opt level: O1

void __thiscall WorkSpace::~WorkSpace(WorkSpace *this)

{
  std::vector<JournalOperation,_std::allocator<JournalOperation>_>::~vector
            ((vector<JournalOperation,_std::allocator<JournalOperation>_> *)(this + 0x168));
  std::vector<DistanceGraph,_std::allocator<DistanceGraph>_>::~vector
            ((vector<DistanceGraph,_std::allocator<DistanceGraph>_> *)(this + 0x150));
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::~vector
            ((vector<KmerCounter,_std::allocator<KmerCounter>_> *)(this + 0x138));
  std::vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_>::~vector
            ((vector<LongReadsDatastore,_std::allocator<LongReadsDatastore>_> *)(this + 0x120));
  std::vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_>::~vector
            ((vector<LinkedReadsDatastore,_std::allocator<LinkedReadsDatastore>_> *)(this + 0x108));
  std::vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_>::~vector
            ((vector<PairedReadsDatastore,_std::allocator<PairedReadsDatastore>_> *)(this + 0xf0));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(this + 0xb0));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(this + 0x98));
  if (*(WorkSpace **)(this + 0x78) != this + 0x88) {
    operator_delete(*(WorkSpace **)(this + 0x78),*(long *)(this + 0x88) + 1);
  }
  if (*(WorkSpace **)(this + 0x58) != this + 0x68) {
    operator_delete(*(WorkSpace **)(this + 0x58),*(long *)(this + 0x68) + 1);
  }
  std::vector<Node,_std::allocator<Node>_>::~vector
            ((vector<Node,_std::allocator<Node>_> *)(this + 0x40));
  if (*(WorkSpace **)(this + 0x20) != this + 0x30) {
    operator_delete(*(WorkSpace **)(this + 0x20),*(long *)(this + 0x30) + 1);
  }
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::~vector((vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             *)(this + 8));
  return;
}

Assistant:

WorkSpace(const WorkSpace& that) = delete;